

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::visitLocalSet
          (Flow *__return_storage_ptr__,ConstantExpressionRunner<wasm::CExpressionRunner> *this,
          LocalSet *curr)

{
  Name breakTo;
  bool bVar1;
  undefined1 local_68 [8];
  Flow setFlow;
  LocalSet *curr_local;
  ConstantExpressionRunner<wasm::CExpressionRunner> *this_local;
  
  setFlow.breakTo.super_IString.str._M_str = (char *)curr;
  if ((this->flags & 1) == 0) {
    ExpressionRunner<wasm::CExpressionRunner>::visit
              ((Flow *)local_68,&this->super_ExpressionRunner<wasm::CExpressionRunner>,curr->value);
    bVar1 = Flow::breaking((Flow *)local_68);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      setLocalValue(this,*(Index *)(setFlow.breakTo.super_IString.str._M_str + 0x10),
                    (Literals *)local_68);
      bVar1 = wasm::Type::isConcrete((Type *)(setFlow.breakTo.super_IString.str._M_str + 8));
      if (bVar1) {
        bVar1 = LocalSet::isTee((LocalSet *)setFlow.breakTo.super_IString.str._M_str);
        if (!bVar1) {
          __assert_fail("curr->isTee()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                        ,0x9c6,
                        "Flow wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::visitLocalSet(LocalSet *) [SubType = wasm::CExpressionRunner]"
                       );
        }
        Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
        bVar1 = true;
      }
      else {
        Flow::Flow(__return_storage_ptr__);
        bVar1 = true;
      }
    }
    Flow::~Flow((Flow *)local_68);
    if (bVar1) {
      return __return_storage_ptr__;
    }
  }
  breakTo.super_IString.str._M_str = DAT_03194068;
  breakTo.super_IString.str._M_len = NONCONSTANT_FLOW;
  Flow::Flow(__return_storage_ptr__,breakTo);
  return __return_storage_ptr__;
}

Assistant:

Flow visitLocalSet(LocalSet* curr) {
    NOTE_ENTER("LocalSet");
    NOTE_EVAL1(curr->index);
    if (!(flags & FlagValues::PRESERVE_SIDEEFFECTS)) {
      // If we are evaluating and not replacing the expression, remember the
      // constant value set, if any, and see if there is a value flowing through
      // a tee.
      auto setFlow = ExpressionRunner<SubType>::visit(curr->value);
      if (!setFlow.breaking()) {
        setLocalValue(curr->index, setFlow.values);
        if (curr->type.isConcrete()) {
          assert(curr->isTee());
          return setFlow;
        }
        return Flow();
      }
    }
    return Flow(NONCONSTANT_FLOW);
  }